

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_open_for_compactor
          (fdb_file_handle **ptr_fhandle,char *filename,fdb_config *fconfig,list *cmp_func_list)

{
  fdb_file_handle *fhandle_00;
  list *cmp_func_list_00;
  list_elem *plVar1;
  list *in_RCX;
  void *in_RSI;
  filemgr *in_RDI;
  fdb_status fs;
  fdb_kvs_handle *handle;
  fdb_file_handle *fhandle;
  fdb_config *in_stack_00001c40;
  fdb_filename_mode_t in_stack_00001c4c;
  char *in_stack_00001c50;
  fdb_kvs_handle *in_stack_00001c58;
  undefined7 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  fdb_status local_4;
  
  fhandle_00 = (fdb_file_handle *)calloc(1,0x28);
  if (fhandle_00 == (fdb_file_handle *)0x0) {
    local_4 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    cmp_func_list_00 = (list *)calloc(1,0x208);
    if (cmp_func_list_00 == (list *)0x0) {
      free(fhandle_00);
      local_4 = FDB_RESULT_ALLOC_FAIL;
    }
    else {
      atomic_init_uint8_t((atomic<unsigned_char> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbf);
      cmp_func_list_00[0x1a].tail = (list_elem *)0x0;
      fdb_file_handle_init
                ((fdb_file_handle *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (fdb_kvs_handle *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      if ((in_RCX != (list *)0x0) && (plVar1 = list_begin(in_RCX), plVar1 != (list_elem *)0x0)) {
        fdb_file_handle_clone_cmp_func_list(fhandle_00,cmp_func_list_00);
      }
      local_4 = _fdb_open(in_stack_00001c58,in_stack_00001c50,in_stack_00001c4c,in_stack_00001c40);
      if (local_4 == FDB_RESULT_SUCCESS) {
        in_RDI->filename = (char *)fhandle_00;
        filemgr_fhandle_add(in_RDI,in_RSI);
      }
      else {
        in_RDI->filename = (char *)0x0;
        free(cmp_func_list_00);
        fdb_file_handle_free((fdb_file_handle *)0x155940);
      }
    }
  }
  return local_4;
}

Assistant:

fdb_status fdb_open_for_compactor(fdb_file_handle **ptr_fhandle,
                                  const char *filename,
                                  fdb_config *fconfig,
                                  struct list *cmp_func_list)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_file_handle *fhandle;
    fdb_kvs_handle *handle;

    fhandle = (fdb_file_handle*)calloc(1, sizeof(fdb_file_handle));
    if (!fhandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        free(fhandle);
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->shandle = NULL;

    fdb_file_handle_init(fhandle, handle);
    if (cmp_func_list && list_begin(cmp_func_list)) {
        fdb_file_handle_clone_cmp_func_list(fhandle, cmp_func_list);
    }
    fdb_status fs = _fdb_open(handle, filename, FDB_VFILENAME, fconfig);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_fhandle = fhandle;
        filemgr_fhandle_add(handle->file, fhandle);
    } else {
        *ptr_fhandle = NULL;
        free(handle);
        fdb_file_handle_free(fhandle);
    }
    return fs;
}